

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall fasttext::FastText::getNN(FastText *this,string *word,int32_t k)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  type this_00;
  undefined4 in_ECX;
  string *in_RDX;
  undefined8 in_RSI;
  iterator in_RDI;
  Vector query;
  unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
  *in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffef8;
  FastText *in_stack_ffffffffffffff00;
  string *psVar2;
  string *local_f8;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff18;
  iterator pbVar3;
  string *word_00;
  Vector *in_stack_ffffffffffffff48;
  FastText *in_stack_ffffffffffffff50;
  string local_a8 [32];
  string *local_88;
  undefined8 local_80;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  int32_t in_stack_ffffffffffffffc4;
  Vector *in_stack_ffffffffffffffc8;
  DenseMatrix *in_stack_ffffffffffffffd0;
  FastText *in_stack_ffffffffffffffd8;
  
  pbVar3 = in_RDI;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1adf75);
  word_00 = (string *)&stack0xffffffffffffffc8;
  Vector::Vector((Vector *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  getWordVector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,word_00,
                (int)((ulong)in_RSI >> 0x20),(float)in_RSI);
  lazyComputeWordVectors(in_stack_ffffffffffffff00);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>
                      *)0x1adfc7);
  if (!bVar1) {
    __assert_fail("wordVectors_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/fasttext.cc"
                  ,0x268,
                  "std::vector<std::pair<real, std::string>> fasttext::FastText::getNN(const std::string &, int32_t)"
                 );
  }
  this_00 = std::unique_ptr<fasttext::DenseMatrix,_std::default_delete<fasttext::DenseMatrix>_>::
            operator*(in_stack_fffffffffffffed0);
  std::__cxx11::string::string(local_a8,in_RDX);
  local_88 = local_a8;
  local_80 = 1;
  __a = (allocator_type *)&stack0xffffffffffffff4e;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1ae074);
  __l._M_len = (size_type)pbVar3;
  __l._M_array = in_RDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)this_00,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        CONCAT44(in_ECX,in_stack_ffffffffffffff18),__a);
  getNN(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
        in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1ae0d8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1ae0e5);
  psVar2 = local_a8;
  local_f8 = (string *)&local_88;
  do {
    local_f8 = local_f8 + -0x20;
    std::__cxx11::string::~string(local_f8);
  } while (local_f8 != psVar2);
  Vector::~Vector((Vector *)0x1ae12f);
  return (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)pbVar3;
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getNN(
    const std::string& word,
    int32_t k) {
  Vector query(args_->dim);

  getWordVector(query, word);

  lazyComputeWordVectors();
  assert(wordVectors_);
  return getNN(*wordVectors_, query, k, {word});
}